

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equalAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  Image *this_00;
  Point3<float> *pPVar1;
  Point3<float> *this_01;
  int iVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  pointer pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Image *this_02;
  bool bVar29;
  allocator_type aVar30;
  array<pbrt::Point3<float>,_4> *this_03;
  long lVar31;
  long in_FS_OFFSET;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_var [56];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar44;
  undefined4 extraout_XMM1_Db;
  undefined4 uVar45;
  undefined4 extraout_XMM1_Dd;
  undefined4 uVar46;
  Vector3<float> VVar47;
  Vector3f x;
  Vector3f y;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  PortalImageInfiniteLight *local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  float local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  string *local_220;
  Transform *local_218;
  Frame *local_210;
  Image *local_208;
  Tuple2<pbrt::Point2,_float> local_200;
  size_t vb;
  float fStack_1f0;
  undefined4 uStack_1ec;
  code *pcStack_1e8;
  code *pcStack_1e0;
  float local_1d8 [8];
  string local_1b8 [96];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  Bounds2<float> local_128;
  _Any_data local_118;
  code *pcStack_108;
  code *pcStack_100;
  Array2D<float> d;
  string local_d0 [32];
  string local_b0 [32];
  Array2D<float> local_90;
  Tuple2<pbrt::Point2,_float> local_70;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_68;
  ImageChannelDesc channelDesc;
  undefined1 auVar43 [56];
  
  (this->super_LightBase).type = Infinite;
  uVar10 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar11 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar12 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar13 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar14 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar16 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar17 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar18 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar19 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar20 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar21 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar22 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar23 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar24 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar10;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar11;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar12;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar13;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar14;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar16;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar17;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar18;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar19;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar20;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar21;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar22;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar23;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar24;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
  this_03 = &this->portal;
  local_218 = renderFromLight;
  local_208 = equalAreaImage;
  pstd::array<pbrt::Point3<float>,_4>::array(this_03);
  local_210 = &this->portalFrame;
  Frame::Frame(local_210);
  this_00 = &this->image;
  Image::Image(this_00,alloc);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D(&this->distribution,alloc);
  this->imageColorSpace = imageColorSpace;
  local_220 = &this->filename;
  this->scale = scale;
  std::__cxx11::string::string((string *)local_220,(string *)filename);
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&d);
  this_02 = local_208;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d8,"G",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"B",(allocator<char> *)&local_290);
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,this_02,requestedChannels);
  lVar31 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&vb + lVar31));
    lVar31 = lVar31 + -0x20;
  } while (lVar31 != -0x20);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for PortalImageInfiniteLight doesn\'t have R, G, B channels.",
               filename);
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x40a,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x52a601,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x52a601,(int *)&d,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  auVar43 = extraout_var;
  uVar45 = extraout_XMM1_Db;
  uVar46 = extraout_XMM1_Dd;
  bVar29 = ImageChannelDesc::IsIdentity(&channelDesc);
  if (!bVar29) {
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x40b,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  TVar3 = (this_02->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (TVar3.x != TVar3.y) {
    vb = (size_t)TVar3;
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar3;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equal area environment map."
               ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  lVar31 = (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar31 != 0x30) {
    vb = lVar31 / 0xc;
    ErrorExit<unsigned_long>("Expected 4 vertices for infinite light portal but given %d",&vb);
  }
  for (lVar31 = 0; lVar31 != 0x30; lVar31 = lVar31 + 0xc) {
    pPVar4 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar31) =
         *(undefined4 *)((long)&(pPVar4->super_Tuple3<pbrt::Point3,_float>).z + lVar31);
    *(undefined8 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar31) =
         *(undefined8 *)((long)&(pPVar4->super_Tuple3<pbrt::Point3,_float>).x + lVar31);
  }
  pPVar1 = (this->portal).values + 1;
  VVar47 = Point3<float>::operator-(pPVar1,this_03->values);
  fStack_1f0 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar35._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar35._8_56_ = auVar43;
  vb = vmovlps_avx(auVar35._0_16_);
  VVar47 = Normalize<float>((Vector3<float> *)&vb);
  fVar44 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar36._8_56_ = auVar43;
  local_268 = auVar36._0_16_;
  this_01 = (this->portal).values + 2;
  VVar47 = Point3<float>::operator-(this_01,pPVar1);
  fStack_1f0 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar37._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar37._8_56_ = auVar43;
  vb = vmovlps_avx(auVar37._0_16_);
  VVar47 = Normalize<float>((Vector3<float> *)&vb);
  local_238 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar38._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar38._8_56_ = auVar43;
  local_278 = auVar38._0_16_;
  uStack_230 = 0;
  pPVar1 = (this->portal).values + 3;
  uStack_234 = uVar45;
  uStack_22c = uVar46;
  VVar47 = Point3<float>::operator-(this_01,pPVar1);
  fStack_1f0 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar39._8_56_ = auVar43;
  vb = vmovlps_avx(auVar39._0_16_);
  VVar47 = Normalize<float>((Vector3<float> *)&vb);
  local_248 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar40._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar40._8_56_ = auVar43;
  local_258 = auVar40._0_16_;
  uStack_240 = 0;
  uStack_244 = uVar45;
  uStack_23c = uVar46;
  VVar47 = Point3<float>::operator-(pPVar1,this_03->values);
  auVar41._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar41._8_56_ = auVar43;
  vb = vmovlps_avx(auVar41._0_16_);
  fStack_1f0 = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar47 = Normalize<float>((Vector3<float> *)&vb);
  x.super_Tuple3<pbrt::Vector3,_float>.z = VVar47.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar42._0_8_ = VVar47.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar42._8_56_ = auVar43;
  local_288 = auVar42._0_16_;
  local_148 = vmovshdup_avx(local_268);
  local_158 = vmovshdup_avx(local_258);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(local_148._0_4_ * local_158._0_4_)),local_268,local_258);
  auVar25._4_4_ = uStack_244;
  auVar25._0_4_ = local_248;
  auVar25._8_4_ = uStack_240;
  auVar25._12_4_ = uStack_23c;
  auVar32 = vfmadd231ss_fma(auVar32,auVar25,ZEXT416((uint)fVar44));
  auVar33._8_4_ = 0x7fffffff;
  auVar33._0_8_ = 0x7fffffff7fffffff;
  auVar33._12_4_ = 0x7fffffff;
  auVar32 = vandps_avx512vl(ZEXT416((uint)(auVar32._0_4_ + -1.0)),auVar33);
  local_138 = vmovshdup_avx(local_278);
  if (0.001 < auVar32._0_4_) {
LAB_003a40dc:
    Error<>("Infinite light portal isn\'t a planar quadrilateral");
  }
  else {
    auVar32._0_4_ = local_278._0_4_ * VVar47.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar32._4_4_ = local_278._4_4_ * VVar47.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar32._8_4_ = local_278._8_4_ * auVar43._0_4_;
    auVar32._12_4_ = local_278._12_4_ * auVar43._4_4_;
    auVar32 = vmovshdup_avx(auVar32);
    auVar32 = vfmadd231ss_fma(auVar32,local_278,local_288);
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)x.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_238));
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(ZEXT416((uint)(auVar32._0_4_ + -1.0)),auVar5);
    if (0.001 < auVar32._0_4_) goto LAB_003a40dc;
  }
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * (float)local_148._0_4_)),
                            local_278,ZEXT416((uint)local_268._0_4_));
  auVar27._4_4_ = uStack_234;
  auVar27._0_4_ = local_238;
  auVar27._8_4_ = uStack_230;
  auVar27._12_4_ = uStack_22c;
  auVar32 = vfmadd231ss_fma(auVar32,auVar27,ZEXT416((uint)fVar44));
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar32 = vandps_avx512vl(auVar32,auVar6);
  if (auVar32._0_4_ <= 0.001) {
    auVar32 = vfmadd132ss_fma(local_278,
                              ZEXT416((uint)((float)local_138._0_4_ * (float)local_158._0_4_)),
                              ZEXT416((uint)local_258._0_4_));
    auVar28._4_4_ = uStack_234;
    auVar28._0_4_ = local_238;
    auVar28._8_4_ = uStack_230;
    auVar28._12_4_ = uStack_22c;
    auVar32 = vfmadd132ss_fma(auVar28,auVar32,ZEXT416((uint)local_248));
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(auVar32,auVar7);
    if (auVar32._0_4_ <= 0.001) {
      auVar32 = vmovshdup_avx(local_288);
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * (float)local_158._0_4_)),local_288,
                                ZEXT416((uint)local_258._0_4_));
      auVar26._4_4_ = uStack_244;
      auVar26._0_4_ = local_248;
      auVar26._8_4_ = uStack_240;
      auVar26._12_4_ = uStack_23c;
      auVar33 = vfmadd132ss_fma(auVar26,auVar33,
                                ZEXT416((uint)x.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar33 = vandps_avx512vl(auVar33,auVar8);
      if (auVar33._0_4_ <= 0.001) {
        auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * (float)local_148._0_4_)),local_288,
                                  ZEXT416((uint)local_268._0_4_));
        auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)x.super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)fVar44));
        auVar9._8_4_ = 0x7fffffff;
        auVar9._0_8_ = 0x7fffffff7fffffff;
        auVar9._12_4_ = 0x7fffffff;
        auVar32 = vandps_avx512vl(auVar32,auVar9);
        if (auVar32._0_4_ <= 0.001) goto LAB_003a4200;
      }
    }
  }
  Error<>("Infinite light portal isn\'t a planar quadrilateral");
LAB_003a4200:
  auVar33 = local_268;
  auVar32 = local_288;
  x.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_288._0_4_;
  x.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_288._4_4_;
  y.super_Tuple3<pbrt::Vector3,_float>.z = fVar44;
  y.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_268._0_4_;
  y.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_268._4_4_;
  local_288 = auVar32;
  local_268 = auVar33;
  Frame::FromXY((Frame *)&vb,x,y);
  (local_210->z).super_Tuple3<pbrt::Vector3,_float>.z = local_1d8[0];
  (local_210->x).super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)vb;
  (local_210->x).super_Tuple3<pbrt::Vector3,_float>.y = (float)vb._4_4_;
  *(undefined8 *)&(local_210->x).super_Tuple3<pbrt::Vector3,_float>.z = _fStack_1f0;
  *(code **)&(local_210->y).super_Tuple3<pbrt::Vector3,_float>.y = pcStack_1e8;
  *(code **)&(local_210->z).super_Tuple3<pbrt::Vector3,_float> = pcStack_1e0;
  TVar3 = (this_02->resolution).super_Tuple2<pbrt::Point2,_int>;
  std::__cxx11::string::string<std::allocator<char>>((string *)&d,"R",(allocator<char> *)&local_128)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"G",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"B",(allocator<char> *)&local_200);
  local_68.bits =
       (this_02->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d;
  Image::Image((Image *)&vb,Float,(Point2i)TVar3,channels,(ColorEncodingHandle *)&local_68,alloc);
  Image::operator=(this_00,(Image *)&vb);
  Image::~Image((Image *)&vb);
  lVar31 = 0x40;
  do {
    std::__cxx11::string::~string(local_d0 + lVar31 + -0x20);
    lVar31 = lVar31 + -0x20;
  } while (lVar31 != -0x20);
  TVar3 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  pcStack_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x18);
  *(PortalImageInfiniteLight **)local_118._M_unused._0_8_ = this;
  pcStack_100 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp:1065:42)>
                ::_M_invoke;
  *(Transform **)((long)local_118._M_unused._0_8_ + 8) = local_218;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x10) = this_02;
  pcStack_108 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp:1065:42)>
                ::_M_manager;
  ParallelFor(0,(long)TVar3 >> 0x20,(function<void_(long)> *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  auVar34._8_4_ = 0x3f800000;
  auVar34._0_8_ = 0x3f8000003f800000;
  auVar34._12_4_ = 0x3f800000;
  local_200.x = 0.0;
  local_200.y = 0.0;
  local_70 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar34);
  Bounds2<float>::Bounds2(&local_128,(Point2<float> *)&local_200,(Point2<float> *)&local_70);
  aVar30.memoryResource = pstd::pmr::new_delete_resource();
  local_290 = this;
  Array2D<float>::Array2D
            (&d,(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x,
             (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y,aVar30);
  iVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  _fStack_1f0 = 0;
  pcStack_1e8 = (code *)0x0;
  pcStack_1e0 = (code *)0x0;
  vb = (size_t)operator_new(0x20);
  pcStack_1e0 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h:445:35)>
                ::_M_invoke;
  *(Image **)vb = this_00;
  *(Bounds2<float> **)(vb + 8) = &local_128;
  *(Array2D<float> **)(vb + 0x10) = &d;
  *(allocator<char> **)(vb + 0x18) = (allocator<char> *)&local_290;
  pcStack_1e8 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h:445:35)>
                ::_M_manager;
  ParallelFor(0,(long)iVar2,(function<void_(long,_long)> *)&vb);
  std::_Function_base::~_Function_base((_Function_base *)&vb);
  aVar30.memoryResource = pstd::pmr::new_delete_resource();
  Array2D<float>::Array2D(&local_90,&d,aVar30);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)&vb,&local_90,alloc);
  WindowedPiecewiseConstant2D::operator=(&this->distribution,(WindowedPiecewiseConstant2D *)&vb);
  WindowedPiecewiseConstant2D::~WindowedPiecewiseConstant2D((WindowedPiecewiseConstant2D *)&vb);
  Array2D<float>::~Array2D(&local_90);
  Array2D<float>::~Array2D(&d);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&channelDesc.offset)
  ;
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equalAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    ImageChannelDesc channelDesc = equalAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equalAreaImage.Resolution().x != equalAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equal area environment map.",
                  filename, equalAreaImage.Resolution().x, equalAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // PortalImageInfiniteLight constructor conclusion
    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p03, p01);

    // Resample environment map into rectified image
    image = Image(PixelFormat::Float, equalAreaImage.Resolution(), {"R", "G", "B"},
                  equalAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // Resample _equalAreaImage_ to compute rectified image pixel $(x,y)$
            // Find $(u,v)$ coordinates in equal-area image for pixel
            Point2f uv((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Vector3f w = RenderFromImage(uv);
            w = Normalize(renderFromLight.ApplyInverse(w));
            Point2f uvEqui = EqualAreaSphereToSquare(w);

            for (int c = 0; c < 3; ++c) {
                Float v =
                    equalAreaImage.BilerpChannel(uvEqui, c, WrapMode::OctahedralSphere);
                image.SetChannel({x, y}, c, v);
            }
        }
    });

    // Initialize sampling distribution for portal image infinite light
    auto duv_dw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duv_dw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}